

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Merger.h
# Opt level: O3

bool __thiscall
PairedEnd::Merger<DNA>::FindBestOverlap
          (Merger<DNA> *this,Sequence<DNA> *seq1,Sequence<DNA> *seq2,OverlapInfo *overlap)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  double local_38;
  
  uVar1 = (uint)(seq1->sequence)._M_string_length;
  uVar2 = (uint)(seq2->sequence)._M_string_length;
  bVar3 = false;
  overlap->length = 0;
  overlap->pos1 = 0;
  overlap->pos2 = 0;
  if (-1 < (int)(uVar2 + uVar1)) {
    local_38 = 2.2250738585072014e-308;
    iVar5 = 0;
    uVar9 = uVar1;
    do {
      uVar4 = iVar5 - uVar1;
      if ((int)(iVar5 - uVar1) < 1) {
        uVar4 = 0;
      }
      iVar6 = uVar2 - uVar4;
      if (iVar5 < (int)(uVar2 - uVar4)) {
        iVar6 = iVar5;
      }
      if (this->mMinOverlap <= iVar6) {
        sVar7 = 0;
        if (0 < (int)uVar9) {
          sVar7 = (size_t)uVar9;
        }
        uVar8 = (ulong)uVar4;
        dVar10 = ComputeOverlapScore(this,(seq1->sequence)._M_dataplus._M_p + sVar7,
                                     (seq2->sequence)._M_dataplus._M_p + uVar8,
                                     (seq1->quality)._M_dataplus._M_p + sVar7,
                                     (seq2->quality)._M_dataplus._M_p + uVar8,(long)iVar6);
        if (local_38 < dVar10) {
          overlap->length = (long)iVar6;
          overlap->pos1 = sVar7;
          overlap->pos2 = uVar8;
          local_38 = dVar10;
        }
      }
      iVar5 = iVar5 + 1;
      uVar9 = uVar9 - 1;
    } while (~uVar2 != uVar9);
    bVar3 = 2.2250738585072014e-308 < local_38;
  }
  return bVar3;
}

Assistant:

bool Merger< A >::FindBestOverlap( const Sequence< A >& seq1,
                                   const Sequence< A >& seq2,
                                   OverlapInfo*         overlap ) const {
  int len1 = seq1.Length();
  int len2 = seq2.Length();

  overlap->length = 0;
  overlap->pos1   = 0;
  overlap->pos2   = 0;

  double bestScore = DBL_MIN;

  // Slide base by base, finding best overlap
  for( int i = 0; i <= len1 + len2; i++ ) {
    int pos1 = std::max( len1 - i, 0 );
    int pos2 = std::max( i - len1, 0 );

    int length = std::min( len2 - pos2, i );
    if( length < mMinOverlap )
      continue;

    double score = ComputeOverlapScore(
      seq1.sequence.c_str() + pos1, seq2.sequence.c_str() + pos2,
      seq1.quality.c_str() + pos1, seq2.quality.c_str() + pos2, length );

    if( score > bestScore ) {
      bestScore       = score;
      overlap->length = length;
      overlap->pos1   = pos1;
      overlap->pos2   = pos2;
    }
  }

  return ( bestScore > DBL_MIN );
}